

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterOpenTempFile(sqlite3 *db,i64 nExtend,sqlite3_file **ppFd)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  i64 max;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (sqlite3Config.xTestCallback != (_func_int_int *)0x0) {
    iVar2 = (*sqlite3Config.xTestCallback)(0xca);
    iVar3 = 0xd0a;
    if (iVar2 != 0) goto LAB_00151982;
  }
  local_2c = -0x55555556;
  local_2c = sqlite3OsOpenMalloc(db->pVfs,(char *)0x0,ppFd,0x101e,&local_2c);
  iVar3 = local_2c;
  if (local_2c == 0) {
    max = 0x7fff0000;
    psVar1 = (*ppFd)->pMethods;
    if (psVar1 != (sqlite3_io_methods *)0x0) {
      (*psVar1->xFileControl)(*ppFd,0x12,&max);
    }
    iVar3 = local_2c;
    if (0 < nExtend) {
      vdbeSorterExtendFile(db,*ppFd,nExtend);
      iVar3 = local_2c;
    }
  }
LAB_00151982:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int vdbeSorterOpenTempFile(
  sqlite3 *db,                    /* Database handle doing sort */
  i64 nExtend,                    /* Attempt to extend file to this size */
  sqlite3_file **ppFd
){
  int rc;
  if( sqlite3FaultSim(202) ) return SQLITE_IOERR_ACCESS;
  rc = sqlite3OsOpenMalloc(db->pVfs, 0, ppFd,
      SQLITE_OPEN_TEMP_JOURNAL |
      SQLITE_OPEN_READWRITE    | SQLITE_OPEN_CREATE |
      SQLITE_OPEN_EXCLUSIVE    | SQLITE_OPEN_DELETEONCLOSE, &rc
  );
  if( rc==SQLITE_OK ){
    i64 max = SQLITE_MAX_MMAP_SIZE;
    sqlite3OsFileControlHint(*ppFd, SQLITE_FCNTL_MMAP_SIZE, (void*)&max);
    if( nExtend>0 ){
      vdbeSorterExtendFile(db, *ppFd, nExtend);
    }
  }
  return rc;
}